

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O3

int main(int argc,char **argv)

{
  vector<run,std::allocator<run>> *this;
  uint uVar1;
  iterator __position;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  pointer pvVar7;
  istream *piVar8;
  ostream *poVar9;
  logic_error *this_00;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  uint i;
  ulong uVar13;
  undefined1 auVar14 [16];
  uint cols;
  uint rows;
  string line;
  grid b;
  istringstream iss;
  ifstream is;
  uint local_434;
  uint local_430;
  uint uStack_42c;
  uint local_428;
  uint uStack_424;
  undefined1 *local_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined7 uStack_407;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  pointer local_3c8;
  long local_3b8 [4];
  byte abStack_398 [88];
  ios_base local_340 [264];
  run local_238;
  long local_228 [2];
  byte abStack_218 [488];
  
  local_3d8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  local_3c8 = (pointer)0x0;
  if (argc != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"USAGE: ",7);
    pcVar12 = *argv;
    if (pcVar12 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x108190);
    }
    else {
      sVar6 = strlen(pcVar12);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," INPUT-FILE",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    iVar5 = 1;
    std::ostream::flush();
    goto LAB_00102d63;
  }
  std::
  vector<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
  ::resize(&G_sum_table,0x2e);
  uVar13 = 0;
  do {
    local_238.set_.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)(uVar13 * 2);
    local_238.target_sum_ = 0;
    uVar10 = 1;
    uVar4 = 0;
    do {
      if (((ulong)local_238.set_.super__Base_bitset<1UL>._M_w >> (uVar10 & 0x3f) & 1) != 0) {
        uVar4 = uVar4 + (int)uVar10;
        local_238.target_sum_ = uVar4;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != 10);
    uVar10 = (long)local_238.set_.super__Base_bitset<1UL>._M_w - (uVar13 & 0x1555555555555555);
    uVar10 = (uVar10 >> 2 & 0x3333333333333333) + (uVar10 & 0x3333333333333333);
    local_238.size_ =
         (uint)(byte)(((uVar10 >> 4) + uVar10 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    this = (vector<run,std::allocator<run>> *)
           (G_sum_table.
            super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + uVar4);
    __position._M_current = *(run **)(this + 8);
    if (__position._M_current == *(run **)(this + 0x10)) {
      std::vector<run,std::allocator<run>>::_M_realloc_insert<run_const&>
                (this,__position,&local_238);
    }
    else {
      (__position._M_current)->size_ = local_238.size_;
      (__position._M_current)->target_sum_ = local_238.target_sum_;
      ((__position._M_current)->set_).super__Base_bitset<1UL>._M_w =
           (_WordT)local_238.set_.super__Base_bitset<1UL>._M_w;
      *(long *)(this + 8) = *(long *)(this + 8) + 0x10;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x200);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,argv[1],(allocator<char> *)local_3b8);
  iVar5 = std::__cxx11::string::compare((char *)&local_238);
  if ((long *)CONCAT44(local_238.target_sum_,local_238.size_) != local_228) {
    operator_delete((long *)CONCAT44(local_238.target_sum_,local_238.size_),local_228[0] + 1);
  }
  if (iVar5 == 0) {
    lVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"SUM: ",5);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"==== ",5);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if (G_sum_table.
          super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar11].
          super__Vector_base<run,_std::allocator<run>_>._M_impl.super__Vector_impl_data._M_finish !=
          G_sum_table.
          super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar11].
          super__Vector_base<run,_std::allocator<run>_>._M_impl.super__Vector_impl_data._M_start) {
        uVar13 = 0;
        do {
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
          uVar10 = 0;
          pvVar7 = G_sum_table.
                   super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          do {
            if ((pvVar7[lVar11].super__Vector_base<run,_std::allocator<run>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar13].set_.super__Base_bitset<1UL>._M_w >>
                 (uVar10 & 0x3f) & 1) != 0) {
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pvVar7 = G_sum_table.
                       super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != 10);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (uVar13 < (ulong)((long)G_sum_table.
                                        super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                        super__Vector_base<run,_std::allocator<run>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)G_sum_table.
                                        super__Vector_base<std::vector<run,_std::allocator<run>_>,_std::allocator<std::vector<run,_std::allocator<run>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar11].
                                        super__Vector_base<run,_std::allocator<run>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 4));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x2e);
    iVar5 = 0;
    goto LAB_00102d63;
  }
  std::ifstream::ifstream(&local_238,argv[1],_S_in);
  if ((abStack_218[*(long *)(CONCAT44(local_238.target_sum_,local_238.size_) + -0x18)] & 5) == 0) {
    local_410 = 0;
    local_408 = 0;
    local_418 = &local_408;
    cVar2 = std::ios::widen((char)&local_238 +
                            (char)*(undefined8 *)
                                   (CONCAT44(local_238.target_sum_,local_238.size_) + -0x18));
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_238,(string *)&local_418,cVar2);
    if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_418,_S_in);
      piVar8 = std::istream::_M_extract<unsigned_int>((uint *)local_3b8);
      piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
        lVar11 = 0x17;
        pcVar12 = "invalid dimensions line";
LAB_00102cc9:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar11);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
LAB_00102d03:
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
        goto LAB_00102d24;
      }
      if (local_430 < 2 || local_428 < 2) {
        lVar11 = 0x39;
        pcVar12 = "invalid dimensions (must be at least 2 in each direction)";
        goto LAB_00102cc9;
      }
      grid::set_size((grid *)local_3f8,local_428,local_430);
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
      cVar2 = std::ios::widen((char)&local_238 +
                              (char)*(undefined8 *)
                                     (CONCAT44(local_238.target_sum_,local_238.size_) + -0x18));
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_238,(string *)&local_418,cVar2);
      if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
        lVar11 = 0x27;
        pcVar12 = "error reading the unfillable cells line";
        goto LAB_00102c0d;
      }
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_3b8,(string *)&local_418,_S_in);
      while (piVar8 = std::istream::_M_extract<unsigned_int>((uint *)local_3b8),
            ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
        *(uint *)(local_3f8._8_8_ + (ulong)local_434 * 4) = 0xffffffff;
      }
      if ((abStack_398[*(long *)(local_3b8[0] + -0x18)] & 2) == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"invalid unfillable cells line",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        goto LAB_00102d03;
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
      std::ios_base::~ios_base(local_340);
      while( true ) {
        cVar2 = std::ios::widen((char)*(undefined8 *)
                                       (CONCAT44(local_238.target_sum_,local_238.size_) + -0x18) +
                                (char)&local_238);
        piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&local_238,(string *)&local_418,cVar2);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_3b8,(string *)&local_418,_S_in);
        piVar8 = std::istream::_M_extract<unsigned_int>((uint *)local_3b8);
        piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
        piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
        piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
        piVar8 = std::istream::_M_extract<unsigned_int>((uint *)piVar8);
        if (((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) != 0) {
          lVar11 = 0x2a;
          pcVar12 = "invalid input format for constraint index ";
LAB_001030e1:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar11);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::endl<char,std::char_traits<char>>(poVar9);
          goto LAB_00102d03;
        }
        auVar14._0_4_ = -(uint)(-0x7fffffd3 < (int)(local_428 ^ 0x80000000));
        auVar14._4_4_ = -(uint)(-0x7fffffd3 < (int)(uStack_424 ^ 0x80000000));
        auVar14._8_4_ = -(uint)(-0x7ffffff7 < (int)(local_428 ^ 0x80000000));
        auVar14._12_4_ = -(uint)(-0x7ffffff7 < (int)(uStack_424 ^ 0x80000000));
        iVar5 = movmskps((int)piVar8,auVar14);
        if (iVar5 != 0) {
          lVar11 = 0x27;
          pcVar12 = "inconsistent data for constraint index ";
          goto LAB_001030e1;
        }
        bVar3 = grid::add_run((grid *)local_3f8,local_434,local_428,local_428,DOWN);
        if (!bVar3) {
          lVar11 = 0x35;
          pcVar12 = "overflowing (down?) run or misplaced constraint cell ";
          goto LAB_001030e1;
        }
        bVar3 = grid::add_run((grid *)local_3f8,local_434,uStack_424,uStack_42c,RIGHT);
        if (!bVar3) {
          lVar11 = 0x36;
          pcVar12 = "overflowing (right?) run or misplaced constraint cell ";
          goto LAB_001030e1;
        }
        std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
        std::ios_base::~ios_base(local_340);
      }
      bVar3 = true;
      if (local_3e8._0_8_ - local_3f8._8_8_ != 0) {
        uVar4 = 1;
        uVar13 = 0;
        pcVar12 = "uncovered cell ";
        lVar11 = 0x1a;
        do {
          uVar1 = *(pointer)(local_3f8._8_8_ + uVar13 * 4);
          if (uVar1 != 0xffffffff) {
            if (uVar1 == 0) {
              if ((((pointer)(local_3d8._0_8_ + uVar13 * 0x10))->r_[0] != (run *)0x0) &&
                 (((pointer)(local_3d8._0_8_ + uVar13 * 0x10))->r_[1] != (run *)0x0))
              goto LAB_00103098;
              pcVar12 = "incompletely covered cell ";
            }
            else {
              lVar11 = 0xf;
              if (uVar1 != 0xfffffffe) {
                this_00 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(this_00,"invalid grid initialization");
                __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar11)
            ;
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            std::endl<char,std::char_traits<char>>(poVar9);
            goto LAB_00102d24;
          }
LAB_00103098:
          uVar13 = (ulong)uVar4;
          uVar4 = uVar4 + 1;
        } while (uVar13 < (ulong)((long)(local_3e8._0_8_ - local_3f8._8_8_) >> 2));
      }
    }
    else {
      lVar11 = 0x21;
      pcVar12 = "error reading the dimensions line";
LAB_00102c0d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar11);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
LAB_00102d24:
      bVar3 = false;
    }
    if (local_418 != &local_408) {
      operator_delete(local_418,CONCAT71(uStack_407,local_408) + 1);
    }
    iVar5 = 1;
    if (bVar3) {
      iVar5 = 0;
      solve((grid *)local_3f8,0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can\'t open input file",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    iVar5 = 1;
    std::ostream::flush();
  }
  std::ifstream::~ifstream(&local_238);
LAB_00102d63:
  if ((pointer)local_3d8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_3d8._0_8_,(long)local_3c8 - local_3d8._0_8_);
  }
  if ((pointer)local_3f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_3f8._8_8_,local_3e8._8_8_ - local_3f8._8_8_);
  }
  return iVar5;
}

Assistant:

int main(int argc, char **argv) try {
	grid b;
	
	if(argc != 2) {
		cerr << "USAGE: " << argv[0] << " INPUT-FILE" << endl;
		return 1;
	}

	generate_sum_table();
	if(string(argv[1]) == "-test") {
		print_sum_table();
		return 0;
	}

	ifstream is(argv[1]);
	if(!is) {
		cerr << "can't open input file" << endl;
		return 1;
	}

	if(!read_data(is, b))
		return 1;
	solve(b, 0);
	return 0;
} catch(exception &e) {
	cerr << "INTERNAL ERROR: " << e.what() << endl;
	return 1;
}